

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O3

bool isbinary(io_buf *i)

{
  ssize_t sVar1;
  char *pcVar2;
  
  pcVar2 = i->head;
  if ((i->space)._end == pcVar2) {
    sVar1 = io_buf::fill(i,(i->files)._begin[i->current]);
    if (sVar1 < 1) {
      return false;
    }
    pcVar2 = i->head;
  }
  if (*pcVar2 != '\0') {
    return false;
  }
  i->head = pcVar2 + 1;
  return true;
}

Assistant:

bool isbinary(io_buf& i)
{
  if (i.space.end() == i.head)
    if (i.fill(i.files[i.current]) <= 0)
      return false;

  bool ret = (*i.head == 0);
  if (ret)
    i.head++;

  return ret;
}